

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-accel.c
# Opt level: O0

int fy_accel_remove(fy_accel *xl,void *data)

{
  fy_accel_entry *xle_00;
  fy_accel_entry *xle;
  void *data_local;
  fy_accel *xl_local;
  
  xle_00 = fy_accel_entry_lookup(xl,data);
  if (xle_00 == (fy_accel_entry *)0x0) {
    xl_local._4_4_ = -1;
  }
  else {
    fy_accel_entry_remove(xl,xle_00);
    xl_local._4_4_ = 0;
  }
  return xl_local._4_4_;
}

Assistant:

int
fy_accel_remove(struct fy_accel *xl, const void *data) {
    struct fy_accel_entry *xle;

    xle = fy_accel_entry_lookup(xl, data);
    if (!xle)
        return -1;

    fy_accel_entry_remove(xl, xle);

    return 0;
}